

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O0

int fits_rdecomp_short(uchar *c,int clen,unsigned_short *array,int nx,int nblock)

{
  short sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  byte bVar6;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  int in_R8D;
  int bbits;
  int fsbits;
  int fsmax;
  uint lastpix;
  uint diff;
  uint b;
  uchar bytevalue;
  uchar *cend;
  int fs;
  int nzero;
  int nbits;
  int k;
  int imax;
  int i;
  uint local_54;
  uint local_50;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  byte *local_10;
  
  sVar1 = CONCAT11(*in_RDI,in_RDI[1]);
  pbVar5 = in_RDI + 2;
  local_10 = in_RDI + 3;
  local_50 = (uint)*pbVar5;
  local_38 = 8;
  local_2c = 0;
  do {
    if (in_ECX <= local_2c) {
      if (local_10 < pbVar5 + (long)in_ESI + -2) {
        ffpmsg((char *)0x254f01);
      }
      return 0;
    }
    for (local_38 = local_38 + -4; local_38 < 0; local_38 = local_38 + 8) {
      local_50 = local_50 << 8 | (uint)*local_10;
      local_10 = local_10 + 1;
    }
    bVar6 = (byte)local_38;
    iVar2 = (local_50 >> (bVar6 & 0x1f)) - 1;
    local_50 = (1 << (bVar6 & 0x1f)) - 1U & local_50;
    local_30 = local_2c + in_R8D;
    if (in_ECX < local_30) {
      local_30 = in_ECX;
    }
    if (iVar2 < 0) {
      for (; local_2c < local_30; local_2c = local_2c + 1) {
        *(short *)(in_RDX + (long)local_2c * 2) = sVar1;
      }
    }
    else if (iVar2 == 0xe) {
      for (; local_2c < local_30; local_2c = local_2c + 1) {
        local_34 = 0x10 - local_38;
        local_54 = local_50 << ((byte)local_34 & 0x1f);
        while( true ) {
          local_34 = local_34 + -8;
          if (local_34 < 0) break;
          local_54 = (uint)*local_10 << ((byte)local_34 & 0x1f) | local_54;
          local_10 = local_10 + 1;
        }
        if (local_38 < 1) {
          local_50 = 0;
        }
        else {
          local_54 = *local_10 >> (-(byte)local_34 & 0x1f) | local_54;
          local_50 = (1 << (bVar6 & 0x1f)) - 1U & (uint)*local_10;
          local_10 = local_10 + 1;
        }
        if ((local_54 & 1) == 0) {
          local_54._0_2_ = (ushort)(local_54 >> 1);
        }
        else {
          local_54._0_2_ = (ushort)(local_54 >> 1) ^ 0xffff;
        }
        *(ushort *)(in_RDX + (long)local_2c * 2) = (ushort)local_54 + sVar1;
        sVar1 = *(short *)(in_RDX + (long)local_2c * 2);
      }
    }
    else {
      for (; local_2c < local_30; local_2c = local_2c + 1) {
        while (local_50 == 0) {
          local_38 = local_38 + 8;
          local_50 = (uint)*local_10;
          local_10 = local_10 + 1;
        }
        iVar3 = local_38 - nonzero_count[local_50];
        local_38 = local_38 - (iVar3 + 1);
        local_50 = 1 << ((byte)local_38 & 0x1f) ^ local_50;
        for (local_38 = local_38 - iVar2; local_38 < 0; local_38 = local_38 + 8) {
          local_50 = local_50 << 8 | (uint)*local_10;
          local_10 = local_10 + 1;
        }
        uVar4 = iVar3 << ((byte)iVar2 & 0x1f) | local_50 >> ((byte)local_38 & 0x1f);
        local_50 = (1 << ((byte)local_38 & 0x1f)) - 1U & local_50;
        if ((uVar4 & 1) == 0) {
          local_54._0_2_ = (ushort)(uVar4 >> 1);
        }
        else {
          local_54._0_2_ = (ushort)(uVar4 >> 1) ^ 0xffff;
        }
        *(ushort *)(in_RDX + (long)local_2c * 2) = (ushort)local_54 + sVar1;
        sVar1 = *(short *)(in_RDX + (long)local_2c * 2);
      }
    }
  } while (local_10 <= pbVar5 + (long)in_ESI + -2);
  ffpmsg((char *)0x254eda);
  return 1;
}

Assistant:

int fits_rdecomp_short (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned short array[],  	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
int i, imax;
/* int bsize; */
int k;
int nbits, nzero, fs;
unsigned char *cend, bytevalue;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */

/*    bsize = 2; */
    
/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 4;
    fsmax = 14;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first 2 bytes of input buffer contain the value of the first */
    /* 2 byte integer value, without any encoding */
    
    lastpix = 0;
    bytevalue = c[0];
    lastpix = lastpix | (bytevalue<<8);
    bytevalue = c[1];
    lastpix = lastpix | bytevalue;

    c += 2;  
    cend = c + clen - 2;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
   
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}